

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

Vec_Str_t * Gia_ManIsoFindString(Gia_Man_t *p,int iPo,int fVerbose,Vec_Int_t **pvPiPerm)

{
  int nCap;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Int_t *vAnds;
  Vec_Int_t *vCos;
  Vec_Str_t *pVVar2;
  int iPo_local;
  Vec_Ptr_t *vEquiv;
  
  iPo_local = iPo;
  p_00 = Gia_ManDupCones(p,&iPo_local,1,1);
  if (p_00->vCos->nSize - p_00->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pPart) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x3ef,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
  }
  if (p_00->vCis->nSize == 0) {
    if (p_00->nObjs != 2) {
      __assert_fail("Gia_ManObjNum(pPart) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x3f3,"Vec_Str_t *Gia_ManIsoFindString(Gia_Man_t *, int, int, Vec_Int_t **)");
    }
    pVVar2 = Gia_AigerWriteIntoMemoryStr(p_00);
    Gia_ManStop(p_00);
    if (pvPiPerm != (Vec_Int_t **)0x0) {
      pVVar1 = Vec_IntAlloc(0);
      *pvPiPerm = pVVar1;
    }
  }
  else {
    vEquiv = Gia_IsoDeriveEquivPos(p_00,0,fVerbose);
    Vec_VecFreeP((Vec_Vec_t **)&vEquiv);
    pVVar1 = Vec_IntAlloc(p_00->vCis->nSize);
    nCap = Gia_ManAndNum(p_00);
    vAnds = Vec_IntAlloc(nCap);
    vCos = Vec_IntAlloc(p_00->vCos->nSize);
    Gia_ManFindCaninicalOrder(p_00,pVVar1,vAnds,vCos,pvPiPerm);
    pVVar2 = Gia_AigerWriteIntoMemoryStrPart(p_00,pVVar1,vAnds,vCos,p_00->nRegs);
    Vec_IntFree(pVVar1);
    Vec_IntFree(vAnds);
    Vec_IntFree(vCos);
    Gia_ManStop(p_00);
  }
  return pVVar2;
}

Assistant:

Vec_Str_t * Gia_ManIsoFindString( Gia_Man_t * p, int iPo, int fVerbose, Vec_Int_t ** pvPiPerm )
{
    Gia_Man_t * pPart;
    Vec_Ptr_t * vEquiv;
    Vec_Int_t * vCis, * vAnds, * vCos;
    Vec_Str_t * vStr;
    // duplicate
    pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
//Gia_ManPrint( pPart );
    assert( Gia_ManPoNum(pPart) == 1 );
    if ( Gia_ManCiNum(pPart) == 0 ) // const AIG
    {
        assert( Gia_ManPoNum(pPart) == 1 );
        assert( Gia_ManObjNum(pPart) == 2 );
        vStr = Gia_AigerWriteIntoMemoryStr( pPart );
        Gia_ManStop( pPart );
        if ( pvPiPerm )
            *pvPiPerm = Vec_IntAlloc( 0 );
        return vStr;
    }
    // derive canonical values
    vEquiv = Gia_IsoDeriveEquivPos( pPart, 0, fVerbose );
    Vec_VecFreeP( (Vec_Vec_t **)&vEquiv );
    // find canonical order
    vCis  = Vec_IntAlloc( Gia_ManCiNum(pPart) );
    vAnds = Vec_IntAlloc( Gia_ManAndNum(pPart) );
    vCos  = Vec_IntAlloc( Gia_ManCoNum(pPart) );
    Gia_ManFindCaninicalOrder( pPart, vCis, vAnds, vCos, pvPiPerm );
//printf( "Internal: " );
//Vec_IntPrint( vCis );
    // derive the AIGER string
    vStr = Gia_AigerWriteIntoMemoryStrPart( pPart, vCis, vAnds, vCos, Gia_ManRegNum(pPart) );
    // cleanup
    Vec_IntFree( vCis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vCos );
    Gia_ManStop( pPart );
    return vStr;
}